

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void get_length16(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                 cio_read_buffer *buffer,size_t num_bytes)

{
  _Bool _Var1;
  uint16_t local_42;
  uint8_t *puStack_40;
  uint16_t field;
  uint8_t *ptr;
  cio_websocket *websocket;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  void *pvStack_18;
  cio_error err_local;
  void *handler_context_local;
  cio_buffered_stream *buffered_stream_local;
  
  ptr = (uint8_t *)handler_context;
  websocket = (cio_websocket *)num_bytes;
  num_bytes_local = (size_t)buffer;
  buffer_local._4_4_ = err;
  pvStack_18 = handler_context;
  handler_context_local = buffered_stream;
  _Var1 = handled_read_error((cio_websocket *)handler_context,err);
  if (!_Var1) {
    puStack_40 = cio_read_buffer_get_read_ptr((cio_read_buffer *)num_bytes_local);
    local_42 = 0;
    memcpy(&local_42,puStack_40,(size_t)websocket);
    cio_read_buffer_consume((cio_read_buffer *)num_bytes_local,(size_t)websocket);
    local_42 = cio_be16toh(local_42);
    *(ulong *)(ptr + 8) = (ulong)local_42;
    *(ulong *)ptr = (ulong)local_42;
    get_mask_or_payload((cio_websocket *)ptr,(cio_buffered_stream *)handler_context_local,
                        (cio_read_buffer *)num_bytes_local);
  }
  return;
}

Assistant:

static void get_length16(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);

	uint16_t field = 0;
	memcpy(&field, ptr, num_bytes);
	cio_read_buffer_consume(buffer, num_bytes);
	field = cio_be16toh(field);
	websocket->ws_private.remaining_read_frame_length = (size_t)field;
	websocket->ws_private.read_frame_length = (size_t)field;
	get_mask_or_payload(websocket, buffered_stream, buffer);
}